

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  ImGuiWindow *this;
  undefined1 auVar1 [12];
  bool bVar2;
  ImU32 IVar3;
  float fVar4;
  uint uVar5;
  ImGuiContext *g;
  ImGuiContext *pIVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  undefined4 in_XMM0_Db;
  ImVec2 IVar10;
  float fVar12;
  ImVec2 IVar11;
  undefined4 in_XMM0_Dc;
  undefined4 uVar13;
  undefined4 in_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined4 uVar14;
  float fVar15;
  float fVar16;
  undefined8 in_XMM2_Qb;
  undefined8 uVar18;
  undefined1 auVar17 [16];
  float fVar19;
  float fVar20;
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect frame_bb;
  ImRect total_bb;
  ImVec2 local_120;
  ImVec2 local_118;
  undefined8 uStack_110;
  ImGuiContext *local_108;
  void *local_100;
  ImU32 local_f8;
  ImU32 local_f4;
  ImVec2 local_f0;
  ImRect local_e8;
  float local_d8;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  ImVec2 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined1 local_78 [16];
  char *local_60;
  undefined1 local_58 [24];
  ImRect local_40;
  
  pIVar6 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  uVar7 = 0xffffffff;
  if (this->SkipItems == false) {
    uStack_80 = in_XMM2_Qb;
    local_88 = (undefined1  [8])frame_size;
    local_100 = data;
    local_d8 = scale_max;
    local_c8 = scale_min;
    uStack_c4 = in_XMM0_Db;
    uStack_c0 = in_XMM0_Dc;
    uStack_bc = in_XMM0_Dd;
    local_118.x = (float)ImGuiWindow::GetID(this,label,(char *)0x0);
    local_a8 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar18 = local_88._8_8_;
    if ((local_88._0_4_ == 0.0) && (!NAN(local_88._0_4_))) {
      fVar9 = CalcItemWidth();
      auVar1._4_8_ = uVar18;
      auVar1._0_4_ = local_88._4_4_;
      auVar17._0_8_ = auVar1._0_8_ << 0x20;
      auVar17._8_4_ = (undefined4)uStack_80;
      auVar17._12_4_ = uStack_80._4_4_;
      register0x000012c4 = auVar17._4_12_;
      local_88._0_4_ = fVar9;
    }
    if ((local_88._4_4_ == 0.0) && (!NAN(local_88._4_4_))) {
      fVar9 = (pIVar6->Style).FramePadding.y;
      local_88._4_4_ = fVar9 + fVar9 + local_a8.y;
    }
    IVar10.x = (this->DC).CursorPos.x + local_88._0_4_;
    fVar15 = local_88._4_4_ + (this->DC).CursorPos.y;
    IVar10.y = fVar15;
    local_e8.Min = (this->DC).CursorPos;
    local_58._0_4_ = (pIVar6->Style).FramePadding.x;
    local_78._0_4_ = (pIVar6->Style).FramePadding.y;
    fVar9 = 0.0;
    if (0.0 < local_a8.x) {
      fVar9 = (pIVar6->Style).ItemInnerSpacing.x + local_a8.x;
    }
    fVar16 = local_e8.Min.x + (float)local_58._0_4_;
    local_b8 = ZEXT416((uint)(local_e8.Min.y + (float)local_78._0_4_));
    local_40.Max.y = fVar15 + 0.0;
    local_40.Max.x = fVar9 + IVar10.x;
    local_108 = pIVar6;
    local_e8.Max = IVar10;
    local_40.Min = local_e8.Min;
    ItemSize(&local_40,(pIVar6->Style).FramePadding.y);
    bVar2 = ItemAdd(&local_40,0,&local_e8,0);
    uVar7 = 0xffffffff;
    if (bVar2) {
      bVar2 = ItemHoverable(&local_e8,(ImGuiID)local_118.x);
      pIVar6 = local_108;
      local_98 = CONCAT71(local_98._1_7_,bVar2);
      if (((local_c8 == 3.4028235e+38) && (!NAN(local_c8))) ||
         ((local_d8 == 3.4028235e+38 && (!NAN(local_d8))))) {
        if (values_count < 1) {
          local_118.x = -3.4028235e+38;
          fVar9 = 3.4028235e+38;
        }
        else {
          iVar8 = 0;
          local_118.x = -3.4028235e+38;
          local_118.y = 0.0;
          uStack_110._0_4_ = 0;
          uStack_110._4_4_ = 0;
          fVar9 = 3.4028235e+38;
          do {
            fVar4 = (*values_getter)(local_100,iVar8);
            if (!NAN(fVar4)) {
              if (fVar4 <= fVar9) {
                fVar9 = fVar4;
              }
              local_118.y = (float)((uint)local_118.y & extraout_var._0_4_);
              uStack_110._0_4_ = (uint)uStack_110 & extraout_var._4_4_;
              uStack_110._4_4_ = uStack_110._4_4_ & extraout_var._8_4_;
              local_118.x = (float)((uint)local_118.x & -(uint)(fVar4 <= local_118.x) |
                                   ~-(uint)(fVar4 <= local_118.x) & (uint)fVar4);
            }
            iVar8 = iVar8 + 1;
          } while (values_count != iVar8);
        }
        uStack_c4 = 0;
        uStack_c0 = 0;
        uStack_bc = 0;
        local_c8 = (float)(~-(uint)(local_c8 == 3.4028235e+38) & (uint)local_c8 |
                          (uint)fVar9 & -(uint)(local_c8 == 3.4028235e+38));
        local_d8 = (float)(~-(uint)(local_d8 == 3.4028235e+38) & (uint)local_d8 |
                          (uint)local_118.x & -(uint)(local_d8 == 3.4028235e+38));
      }
      IVar11 = local_e8.Max;
      local_118 = local_e8.Min;
      uStack_110 = 0;
      IVar3 = GetColorU32(7,1.0);
      RenderFrame(local_118,IVar11,IVar3,true,(pIVar6->Style).FrameRounding);
      uVar7 = 0xffffffff;
      fVar9 = (float)local_b8._0_4_;
      if ((int)((plot_type == ImGuiPlotType_Lines) + 1) <= values_count) {
        fVar9 = IVar10.x - (float)local_58._0_4_;
        fVar15 = fVar15 - (float)local_78._0_4_;
        iVar8 = (int)(float)local_88._0_4_;
        if (values_count <= (int)(float)local_88._0_4_) {
          iVar8 = values_count;
        }
        fVar4 = (float)(values_count - (uint)(plot_type == ImGuiPlotType_Lines));
        local_118.x = fVar4;
        uVar7 = 0xffffffff;
        local_60 = label;
        if (((((char)local_98 != '\0') && (fVar19 = (local_108->IO).MousePos.x, fVar16 <= fVar19))
            && (fVar20 = (local_108->IO).MousePos.y, (float)local_b8._0_4_ <= fVar20)) &&
           ((fVar19 < fVar9 && (fVar20 < fVar15)))) {
          fVar20 = (fVar19 - fVar16) / (fVar9 - fVar16);
          fVar19 = 0.9999;
          if (fVar20 <= 0.9999) {
            fVar19 = fVar20;
          }
          uVar7 = (uint)((float)(int)fVar4 * (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar19));
          if (((int)uVar7 < 0) || (values_count <= (int)uVar7)) {
            __assert_fail("v_idx >= 0 && v_idx < values_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                          ,0x1964,
                          "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar4 = (*values_getter)(local_100,(int)(values_offset + uVar7) % values_count);
          (*values_getter)(local_100,(int)(values_offset + uVar7 + 1) % values_count);
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar7,(ulong)(uVar7 + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)fVar4,(ulong)uVar7);
          }
        }
        iVar8 = iVar8 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_78 = ZEXT416(~-(uint)(local_c8 == local_d8) & (uint)(1.0 / (local_d8 - local_c8)));
        fVar4 = (*values_getter)(local_100,values_offset % values_count);
        if (0.0 <= local_d8 * local_c8) {
          local_98 = (ulong)~-(uint)(local_c8 < 0.0) & 0xffffffff3f800000;
          uStack_90 = 0;
        }
        else {
          local_98 = CONCAT44(uStack_c4,local_c8 * (float)local_78._0_4_ + 1.0);
          uStack_90 = CONCAT44(uStack_bc,uStack_c0);
        }
        local_f4 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x28,1.0);
        local_f8 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x29,1.0);
        if (iVar8 < 1) {
          pIVar6 = local_108;
          label = local_60;
          fVar9 = (float)local_b8._0_4_;
        }
        else {
          fVar19 = (float)local_78._0_4_ * (fVar4 - local_c8);
          fVar4 = 1.0;
          if (fVar19 <= 1.0) {
            fVar4 = fVar19;
          }
          local_d8 = (float)(int)local_118.x;
          local_58._0_16_ = ZEXT416((uint)(1.0 / (float)iVar8));
          fVar15 = fVar15 - (float)local_b8._0_4_;
          local_98 = CONCAT44(local_98._4_4_,(float)local_98 * fVar15 + (float)local_b8._0_4_);
          fVar20 = 0.0;
          fVar12 = 0.0;
          uVar13 = 0;
          uVar14 = 0;
          fVar4 = (float)(-(uint)(fVar19 < 0.0) & 0x3f800000 |
                         ~-(uint)(fVar19 < 0.0) & (uint)(1.0 - fVar4));
          do {
            uVar5 = (uint)(fVar20 * local_d8 + 0.5);
            if (((int)uVar5 < 0) || (values_count <= (int)uVar5)) {
              __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                            ,0x197e,
                            "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            local_118.y = (float)local_58._4_4_;
            local_118.x = (float)local_58._0_4_ + fVar20;
            uStack_110 = local_58._8_8_;
            local_88._4_4_ = fVar12;
            local_88._0_4_ = fVar20;
            uStack_80._0_4_ = uVar13;
            uStack_80._4_4_ = uVar14;
            fVar19 = (*values_getter)(local_100,(int)(values_offset + 1 + uVar5) % values_count);
            fVar20 = (fVar19 - local_c8) * (float)local_78._0_4_;
            fVar19 = 1.0;
            if (fVar20 <= 1.0) {
              fVar19 = fVar20;
            }
            fVar19 = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar20 < 0.0) & (uint)(1.0 - fVar19));
            fVar20 = (float)local_88._0_4_ * (fVar9 - fVar16) + fVar16;
            local_f0.y = fVar4 * fVar15 + (float)local_b8._0_4_;
            local_f0.x = fVar20;
            local_120.x = (fVar9 - fVar16) * local_118.x + fVar16;
            if (plot_type == ImGuiPlotType_Lines) {
              local_120.y = fVar15 * fVar19 + (float)local_b8._0_4_;
              IVar3 = local_f4;
              if (uVar7 == uVar5) {
                IVar3 = local_f8;
              }
              ImDrawList::AddLine(this->DrawList,&local_f0,&local_120,IVar3,1.0);
            }
            else {
              local_120.y = (float)local_98;
              if (plot_type == ImGuiPlotType_Histogram) {
                if (fVar20 + 2.0 <= local_120.x) {
                  local_120.x = local_120.x + -1.0;
                }
                IVar3 = local_f4;
                if (uVar7 == uVar5) {
                  IVar3 = local_f8;
                }
                ImDrawList::AddRectFilled(this->DrawList,&local_f0,&local_120,IVar3,0.0,0);
              }
            }
            iVar8 = iVar8 + -1;
            fVar20 = local_118.x;
            fVar12 = local_118.y;
            uVar13 = (uint)uStack_110;
            uVar14 = uStack_110._4_4_;
            fVar4 = fVar19;
          } while (iVar8 != 0);
          pIVar6 = local_108;
          label = local_60;
          fVar9 = (float)local_b8._0_4_;
        }
      }
      fVar15 = local_a8.x;
      if (overlay_text != (char *)0x0) {
        local_f0.y = local_e8.Min.y + (pIVar6->Style).FramePadding.y;
        local_f0.x = local_e8.Min.x;
        local_120.x = 0.5;
        local_120.y = 0.0;
        RenderTextClipped(&local_f0,&local_e8.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_120,
                          (ImRect *)0x0);
        fVar15 = local_a8.x;
        fVar9 = (float)local_b8._0_4_;
      }
      if (0.0 < fVar15) {
        IVar11.x = local_e8.Max.x + (pIVar6->Style).ItemInnerSpacing.x;
        IVar11.y = fVar9;
        RenderText(IVar11,label,(char *)0x0,true);
      }
    }
  }
  return uVar7;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (1 + scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}